

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_avx2.c
# Opt level: O2

void nn_propagate_input_multiple_of_8
               (float *inputs,float *weights,float *bias,int num_inputs_to_process,
               int tot_num_inputs,_Bool is_output_layer,int num_outputs,float *output_nodes)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int in;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int in_1;
  long lVar19;
  int iVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  float fVar24;
  float fVar25;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar26 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 in_ZMM4 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  bVar21 = num_inputs_to_process == tot_num_inputs;
  lVar14 = (long)num_inputs_to_process;
  if ((num_outputs & 7U) == 0) {
    iVar20 = 0;
    for (lVar12 = 0; lVar12 < num_outputs; lVar12 = lVar12 + 8) {
      pfVar1 = bias + lVar12;
      fVar29 = *pfVar1;
      fVar31 = pfVar1[1];
      fVar24 = pfVar1[2];
      fVar27 = pfVar1[3];
      fVar33 = pfVar1[4];
      fVar35 = pfVar1[5];
      fVar37 = pfVar1[6];
      fVar39 = pfVar1[7];
      fVar30 = 0.0;
      fVar32 = 0.0;
      fVar25 = 0.0;
      fVar28 = 0.0;
      fVar34 = 0.0;
      fVar36 = 0.0;
      fVar38 = 0.0;
      fVar40 = 0.0;
      iVar16 = iVar20;
      for (lVar19 = 0; lVar19 < lVar14; lVar19 = lVar19 + 8) {
        pfVar1 = inputs + lVar19;
        fVar5 = *pfVar1;
        fVar6 = pfVar1[1];
        fVar7 = pfVar1[2];
        fVar8 = pfVar1[3];
        fVar9 = pfVar1[4];
        fVar10 = pfVar1[5];
        fVar11 = pfVar1[6];
        iVar18 = iVar16;
        for (lVar13 = 0; lVar13 != 0x80; lVar13 = lVar13 + 0x20) {
          pfVar1 = weights + iVar18;
          auVar41._0_4_ = fVar5 * *pfVar1;
          auVar41._4_4_ = fVar6 * pfVar1[1];
          auVar41._8_4_ = fVar7 * pfVar1[2];
          auVar41._12_4_ = fVar8 * pfVar1[3];
          auVar41._16_4_ = fVar9 * pfVar1[4];
          auVar41._20_4_ = fVar10 * pfVar1[5];
          auVar41._28_36_ = in_ZMM4._28_36_;
          auVar41._24_4_ = fVar11 * pfVar1[6];
          pfVar1 = weights + (tot_num_inputs + iVar18);
          auVar43._0_4_ = fVar5 * *pfVar1;
          auVar43._4_4_ = fVar6 * pfVar1[1];
          auVar43._8_4_ = fVar7 * pfVar1[2];
          auVar43._12_4_ = fVar8 * pfVar1[3];
          auVar43._16_4_ = fVar9 * pfVar1[4];
          auVar43._20_4_ = fVar10 * pfVar1[5];
          auVar43._28_36_ = in_ZMM5._28_36_;
          auVar43._24_4_ = fVar11 * pfVar1[6];
          in_ZMM5 = ZEXT3264(auVar43._0_32_);
          auVar23 = vhaddps_avx(auVar41._0_32_,auVar43._0_32_);
          in_ZMM4 = ZEXT3264(auVar23);
          *(undefined1 (*) [32])(local_e0 + lVar13) = auVar23;
          iVar18 = iVar18 + tot_num_inputs * 2;
        }
        auVar23 = vhaddps_avx(local_e0,local_c0);
        auVar3 = vhaddps_avx(local_a0,local_80);
        in_ZMM4 = ZEXT3264(auVar3);
        in_ZMM5 = ZEXT3264(CONCAT1616(auVar3._0_16_,auVar23._0_16_));
        auVar4 = vperm2f128_avx(auVar23,auVar3,0x31);
        fVar25 = fVar25 + auVar23._0_4_ + auVar4._0_4_;
        fVar28 = fVar28 + auVar23._4_4_ + auVar4._4_4_;
        fVar30 = fVar30 + auVar23._8_4_ + auVar4._8_4_;
        fVar32 = fVar32 + auVar23._12_4_ + auVar4._12_4_;
        fVar34 = fVar34 + auVar3._0_4_ + auVar4._16_4_;
        fVar36 = fVar36 + auVar3._4_4_ + auVar4._20_4_;
        fVar38 = fVar38 + auVar3._8_4_ + auVar4._24_4_;
        fVar40 = fVar40 + auVar3._12_4_ + auVar4._28_4_;
        iVar16 = iVar16 + 8;
      }
      auVar23._0_4_ = fVar29 + fVar25;
      auVar23._4_4_ = fVar31 + fVar28;
      auVar23._8_4_ = fVar24 + fVar30;
      auVar23._12_4_ = fVar27 + fVar32;
      auVar23._16_4_ = fVar33 + fVar34;
      auVar23._20_4_ = fVar35 + fVar36;
      auVar23._24_4_ = fVar37 + fVar38;
      auVar23._28_4_ = fVar39 + fVar40;
      if (!is_output_layer && bVar21) {
        auVar23 = vmaxps_avx(auVar23,ZEXT832(0));
      }
      *(undefined1 (*) [32])(output_nodes + lVar12) = auVar23;
      iVar20 = iVar20 + tot_num_inputs * 8;
    }
  }
  else if ((num_outputs & 3U) == 0) {
    iVar20 = 0;
    for (lVar12 = 0; lVar12 < num_outputs; lVar12 = lVar12 + 4) {
      pfVar1 = bias + lVar12;
      fVar29 = *pfVar1;
      fVar31 = pfVar1[1];
      fVar24 = pfVar1[2];
      fVar27 = pfVar1[3];
      fVar33 = 0.0;
      fVar35 = 0.0;
      fVar37 = 0.0;
      fVar39 = 0.0;
      iVar16 = iVar20;
      for (lVar19 = 0; lVar19 < lVar14; lVar19 = lVar19 + 8) {
        pfVar1 = inputs + lVar19;
        fVar30 = *pfVar1;
        fVar32 = pfVar1[1];
        fVar25 = pfVar1[2];
        fVar28 = pfVar1[3];
        fVar34 = pfVar1[4];
        fVar36 = pfVar1[5];
        fVar38 = pfVar1[6];
        iVar18 = iVar16;
        for (lVar13 = 0; lVar13 != 0x40; lVar13 = lVar13 + 0x20) {
          pfVar1 = weights + iVar18;
          auVar42._0_4_ = fVar30 * *pfVar1;
          auVar42._4_4_ = fVar32 * pfVar1[1];
          auVar42._8_4_ = fVar25 * pfVar1[2];
          auVar42._12_4_ = fVar28 * pfVar1[3];
          auVar42._16_4_ = fVar34 * pfVar1[4];
          auVar42._20_4_ = fVar36 * pfVar1[5];
          auVar42._28_36_ = in_ZMM4._28_36_;
          auVar42._24_4_ = fVar38 * pfVar1[6];
          pfVar1 = weights + (tot_num_inputs + iVar18);
          auVar44._0_4_ = fVar30 * *pfVar1;
          auVar44._4_4_ = fVar32 * pfVar1[1];
          auVar44._8_4_ = fVar25 * pfVar1[2];
          auVar44._12_4_ = fVar28 * pfVar1[3];
          auVar44._16_4_ = fVar34 * pfVar1[4];
          auVar44._20_4_ = fVar36 * pfVar1[5];
          auVar44._28_36_ = in_ZMM5._28_36_;
          auVar44._24_4_ = fVar38 * pfVar1[6];
          in_ZMM5 = ZEXT3264(auVar44._0_32_);
          auVar23 = vhaddps_avx(auVar42._0_32_,auVar44._0_32_);
          in_ZMM4 = ZEXT3264(auVar23);
          *(undefined1 (*) [32])(local_e0 + lVar13) = auVar23;
          iVar18 = iVar18 + tot_num_inputs * 2;
        }
        auVar23 = vhaddps_avx(local_e0,local_c0);
        in_ZMM4 = ZEXT1664(auVar23._16_16_);
        fVar33 = fVar33 + auVar23._0_4_ + auVar23._16_4_;
        fVar35 = fVar35 + auVar23._4_4_ + auVar23._20_4_;
        fVar37 = fVar37 + auVar23._8_4_ + auVar23._24_4_;
        fVar39 = fVar39 + auVar23._12_4_ + auVar23._28_4_;
        iVar16 = iVar16 + 8;
      }
      auVar22._0_4_ = fVar29 + fVar33;
      auVar22._4_4_ = fVar31 + fVar35;
      auVar22._8_4_ = fVar24 + fVar37;
      auVar22._12_4_ = fVar27 + fVar39;
      if (!is_output_layer && bVar21) {
        auVar22 = vmaxps_avx(auVar22,ZEXT816(0));
      }
      *(undefined1 (*) [16])(output_nodes + lVar12) = auVar22;
      iVar20 = iVar20 + tot_num_inputs * 4;
    }
  }
  else {
    uVar17 = 0;
    uVar15 = (ulong)(uint)num_outputs;
    if (num_outputs < 1) {
      uVar15 = uVar17;
    }
    for (; uVar17 != uVar15; uVar17 = uVar17 + 1) {
      fVar29 = 0.0;
      fVar31 = 0.0;
      fVar24 = 0.0;
      fVar27 = 0.0;
      fVar33 = 0.0;
      fVar35 = 0.0;
      fVar37 = 0.0;
      fVar39 = 0.0;
      for (lVar12 = 0; lVar12 < lVar14; lVar12 = lVar12 + 8) {
        pfVar1 = inputs + lVar12;
        pfVar2 = weights + lVar12;
        fVar24 = fVar24 + *pfVar1 * *pfVar2;
        fVar27 = fVar27 + pfVar1[1] * pfVar2[1];
        fVar29 = fVar29 + pfVar1[2] * pfVar2[2];
        fVar31 = fVar31 + pfVar1[3] * pfVar2[3];
        fVar33 = fVar33 + pfVar1[4] * pfVar2[4];
        fVar35 = fVar35 + pfVar1[5] * pfVar2[5];
        fVar37 = fVar37 + pfVar1[6] * pfVar2[6];
        fVar39 = fVar39 + pfVar1[7];
      }
      auVar26._0_4_ = fVar24 + fVar33;
      auVar26._4_4_ = fVar27 + fVar35;
      auVar26._8_4_ = fVar29 + fVar37;
      auVar26._12_4_ = fVar31 + fVar39;
      auVar22 = vhaddps_avx(auVar26,auVar26);
      auVar22 = vhaddps_avx(auVar22,auVar22);
      fVar29 = bias[uVar17] + auVar22._0_4_;
      if (!is_output_layer && bVar21) {
        auVar22 = vmaxss_avx(ZEXT416((uint)fVar29),ZEXT816(0));
        fVar29 = auVar22._0_4_;
      }
      output_nodes[uVar17] = fVar29;
      weights = weights + tot_num_inputs;
    }
  }
  return;
}

Assistant:

static inline void nn_propagate_input_multiple_of_8(
    const float *const inputs, const float *const weights,
    const float *const bias, int num_inputs_to_process, int tot_num_inputs,
    bool is_output_layer, int num_outputs, float *const output_nodes) {
  // The saturation of output is considered for hidden layer which is not equal
  // to final hidden layer.
  const int is_clip_required =
      !is_output_layer && num_inputs_to_process == tot_num_inputs;
  if (num_outputs % 8 == 0) {
    nn_propagate_8to8(inputs, weights, bias, num_inputs_to_process,
                      tot_num_inputs, num_outputs, output_nodes,
                      is_clip_required);
  } else if (num_outputs % 4 == 0) {
    nn_propagate_8to4(inputs, weights, bias, num_inputs_to_process,
                      tot_num_inputs, num_outputs, output_nodes,
                      is_clip_required);
  } else {
    nn_propagate_8to1(inputs, weights, bias, num_inputs_to_process,
                      tot_num_inputs, num_outputs, output_nodes,
                      is_clip_required);
  }
}